

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Word.h
# Opt level: O3

void __thiscall Word::~Word(Word *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_Token)._vptr_Token = (_func_int **)&PTR__Word_00178890;
  pcVar1 = (this->lexeme)._M_dataplus._M_p;
  paVar2 = &(this->lexeme).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  (this->super_Token)._vptr_Token = (_func_int **)&PTR__Token_001788e0;
  pcVar1 = (this->super_Token).Literal._M_dataplus._M_p;
  paVar2 = &(this->super_Token).Literal.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~Word(){

    }